

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes ReadUnpackInfo(CSzAr *p,CSzData *sd2,UInt32 numFoldersMax,CBuf *tempBufs,UInt32 numTempBufs,
                   ISzAlloc *alloc)

{
  Byte BVar1;
  SRes SVar2;
  size_t *psVar3;
  UInt32 *pUVar4;
  Byte *pBVar5;
  int __result___14;
  int __result___13;
  int __result___12;
  UInt64 type;
  uint local_168;
  int __result___11;
  UInt32 i_1;
  int __result___10;
  size_t dataSize;
  uint local_150;
  int __result___9;
  UInt32 index_2;
  int __result___8;
  int __result___7;
  UInt32 index_1;
  UInt32 numBonds;
  UInt32 i;
  Byte coderUsed [64];
  Byte streamUsed [64];
  Byte local_b0;
  UInt32 numPackStreams;
  UInt32 indexOfMainStream;
  int __result___6;
  UInt32 propsSize;
  int __result___5;
  int __result___4;
  UInt32 coderOutStreams;
  UInt32 coderInStreams;
  uint idSize;
  uint uStack_88;
  Byte mainByte;
  int __result___3;
  UInt32 numInStreams;
  UInt32 ci;
  UInt32 numCoders;
  int __result___2;
  UInt32 index;
  int __result___1;
  int __result__;
  Byte external;
  Byte *startBufPtr;
  UInt32 packStreamIndex;
  UInt32 numCodersOutStreams;
  UInt32 numFolders;
  UInt32 fo;
  CSzData sd;
  ISzAlloc *alloc_local;
  UInt32 numTempBufs_local;
  CBuf *tempBufs_local;
  UInt32 numFoldersMax_local;
  CSzData *sd2_local;
  CSzAr *p_local;
  
  sd.Size = (size_t)alloc;
  index = WaitId(sd2,0xb);
  p_local._4_4_ = index;
  if ((index == 0) &&
     (__result___2 = SzReadNumber32(sd2,&packStreamIndex), p_local._4_4_ = __result___2,
     __result___2 == 0)) {
    if (numFoldersMax < packStreamIndex) {
      p_local._4_4_ = 4;
    }
    else {
      p->NumFolders = packStreamIndex;
      if (sd2->Size == 0) {
        p_local._4_4_ = 0x10;
      }
      else {
        sd2->Size = sd2->Size - 1;
        pBVar5 = sd2->Data;
        sd2->Data = pBVar5 + 1;
        __result___1._3_1_ = *pBVar5;
        if (__result___1._3_1_ == '\0') {
          _numFolders = sd2->Data;
          sd.Data = (Byte *)sd2->Size;
        }
        else {
          SVar2 = SzReadNumber32(sd2,&numCoders);
          if (SVar2 != 0) {
            return SVar2;
          }
          if (numTempBufs <= numCoders) {
            return 0x10;
          }
          _numFolders = tempBufs[numCoders].data;
          sd.Data = (Byte *)tempBufs[numCoders].size;
          ci = 0;
        }
        psVar3 = (size_t *)(**(code **)sd.Size)(sd.Size,((ulong)packStreamIndex + 1) * 8);
        p->FoCodersOffsets = psVar3;
        if (psVar3 == (size_t *)0x0) {
          p_local._4_4_ = 2;
        }
        else {
          pUVar4 = (UInt32 *)(**(code **)sd.Size)(sd.Size,((ulong)packStreamIndex + 1) * 4);
          p->FoStartPackStreamIndex = pUVar4;
          if (pUVar4 == (UInt32 *)0x0) {
            p_local._4_4_ = 2;
          }
          else {
            pUVar4 = (UInt32 *)(**(code **)sd.Size)(sd.Size,((ulong)packStreamIndex + 1) * 4);
            p->FoToCoderUnpackSizes = pUVar4;
            if (pUVar4 == (UInt32 *)0x0) {
              p_local._4_4_ = 2;
            }
            else {
              pBVar5 = (Byte *)(**(code **)sd.Size)(sd.Size,packStreamIndex);
              p->FoToMainUnpackSizeIndex = pBVar5;
              if (pBVar5 == (Byte *)0x0) {
                p_local._4_4_ = 2;
              }
              else {
                ___result__ = _numFolders;
                startBufPtr._0_4_ = 0;
                startBufPtr._4_4_ = 0;
                for (numCodersOutStreams = 0; numCodersOutStreams < packStreamIndex;
                    numCodersOutStreams = numCodersOutStreams + 1) {
                  uStack_88 = 0;
                  p->FoCodersOffsets[numCodersOutStreams] = (long)_numFolders - (long)___result__;
                  idSize = SzReadNumber32((CSzData *)&numFolders,&numInStreams);
                  if (idSize != 0) {
                    return idSize;
                  }
                  if ((numInStreams == 0) || (0x40 < numInStreams)) {
                    return 4;
                  }
                  for (__result___3 = 0; (uint)__result___3 < numInStreams;
                      __result___3 = __result___3 + 1) {
                    if (sd.Data == (Byte *)0x0) {
                      return 0x10;
                    }
                    coderInStreams._3_1_ = *_numFolders;
                    if ((coderInStreams._3_1_ & 0xc0) != 0) {
                      return 4;
                    }
                    coderOutStreams = coderInStreams._3_1_ & 0xf;
                    if (8 < coderOutStreams) {
                      return 4;
                    }
                    if (sd.Data + -1 < (Byte *)(ulong)coderOutStreams) {
                      return 0x10;
                    }
                    sd.Data = sd.Data + -1 + -(ulong)coderOutStreams;
                    _numFolders = _numFolders + (ulong)coderOutStreams + 1;
                    __result___4 = 1;
                    if ((coderInStreams._3_1_ & 0x10) != 0) {
                      propsSize = SzReadNumber32((CSzData *)&numFolders,(UInt32 *)&__result___4);
                      if (propsSize != 0) {
                        return propsSize;
                      }
                      __result___6 = SzReadNumber32((CSzData *)&numFolders,(UInt32 *)&__result___5);
                      if (__result___6 != 0) {
                        return __result___6;
                      }
                      if ((0x40 < (uint)__result___4) || (__result___5 != 1)) {
                        return 4;
                      }
                    }
                    uStack_88 = __result___4 + uStack_88;
                    if ((coderInStreams._3_1_ & 0x20) != 0) {
                      SVar2 = SzReadNumber32((CSzData *)&numFolders,&indexOfMainStream);
                      if (SVar2 != 0) {
                        return SVar2;
                      }
                      if (sd.Data < (Byte *)(ulong)indexOfMainStream) {
                        return 0x10;
                      }
                      sd.Data = sd.Data + -(ulong)indexOfMainStream;
                      _numFolders = _numFolders + indexOfMainStream;
                    }
                  }
                  local_b0 = '\0';
                  BVar1 = local_b0;
                  local_b0 = '\0';
                  streamUsed[0x3c] = '\x01';
                  streamUsed[0x3d] = '\0';
                  streamUsed[0x3e] = '\0';
                  streamUsed[0x3f] = '\0';
                  if ((numInStreams != 1) || (uStack_88 != 1)) {
                    __result___7 = numInStreams - 1;
                    if (uStack_88 < (uint)__result___7) {
                      return 0x10;
                    }
                    if (0x40 < uStack_88) {
                      return 4;
                    }
                    for (index_1 = 0; index_1 < uStack_88; index_1 = index_1 + 1) {
                      coderUsed[(ulong)index_1 + 0x38] = '\0';
                    }
                    for (index_1 = 0; index_1 < numInStreams; index_1 = index_1 + 1) {
                      *(undefined1 *)((long)&numBonds + (ulong)index_1) = 0;
                    }
                    for (index_1 = 0; index_1 < (uint)__result___7; index_1 = index_1 + 1) {
                      index_2 = SzReadNumber32((CSzData *)&numFolders,(UInt32 *)&__result___8);
                      if (index_2 != 0) {
                        return index_2;
                      }
                      if ((uStack_88 <= (uint)__result___8) ||
                         (coderUsed[(ulong)(uint)__result___8 + 0x38] != '\0')) {
                        return 0x10;
                      }
                      coderUsed[(ulong)(uint)__result___8 + 0x38] = '\x01';
                      SVar2 = SzReadNumber32((CSzData *)&numFolders,(UInt32 *)&__result___8);
                      if (SVar2 != 0) {
                        return SVar2;
                      }
                      if ((numInStreams <= (uint)__result___8) ||
                         (*(char *)((long)&numBonds + (ulong)(uint)__result___8) != '\0')) {
                        return 0x10;
                      }
                      *(undefined1 *)((long)&numBonds + (ulong)(uint)__result___8) = 1;
                      __result___9 = 0;
                    }
                    streamUsed._60_4_ = uStack_88 - __result___7;
                    if (streamUsed._60_4_ != 1) {
                      for (index_1 = 0; index_1 < (uint)streamUsed._60_4_; index_1 = index_1 + 1) {
                        SVar2 = SzReadNumber32((CSzData *)&numFolders,&local_150);
                        if (SVar2 != 0) {
                          return SVar2;
                        }
                        if ((uStack_88 <= local_150) || (coderUsed[(ulong)local_150 + 0x38] != '\0')
                           ) {
                          return 0x10;
                        }
                        coderUsed[(ulong)local_150 + 0x38] = '\x01';
                        dataSize._4_4_ = 0;
                      }
                    }
                    for (index_1 = 0; local_b0 = BVar1, index_1 < numInStreams;
                        index_1 = index_1 + 1) {
                      if (*(char *)((long)&numBonds + (ulong)index_1) == '\0') {
                        local_b0 = (Byte)index_1;
                        break;
                      }
                    }
                    if (index_1 == numInStreams) {
                      return 0x10;
                    }
                  }
                  p->FoStartPackStreamIndex[numCodersOutStreams] = (UInt32)startBufPtr;
                  p->FoToCoderUnpackSizes[numCodersOutStreams] = startBufPtr._4_4_;
                  p->FoToMainUnpackSizeIndex[numCodersOutStreams] = local_b0;
                  startBufPtr._4_4_ = numInStreams + startBufPtr._4_4_;
                  if (startBufPtr._4_4_ < numInStreams) {
                    return 4;
                  }
                  if (p->NumPackStreams - (UInt32)startBufPtr < (uint)streamUsed._60_4_) {
                    return 0x10;
                  }
                  startBufPtr._0_4_ = streamUsed._60_4_ + (UInt32)startBufPtr;
                }
                p->FoToCoderUnpackSizes[numCodersOutStreams] = startBufPtr._4_4_;
                _i_1 = (long)_numFolders - (long)___result__;
                p->FoStartPackStreamIndex[numCodersOutStreams] = (UInt32)startBufPtr;
                p->FoCodersOffsets[numCodersOutStreams] = _i_1;
                if (_i_1 == 0) {
                  sd2_local = (CSzData *)0x0;
                }
                else {
                  pBVar5 = (Byte *)(**(code **)sd.Size)(sd.Size,_i_1);
                  p->CodersData = pBVar5;
                  if (pBVar5 == (Byte *)0x0) {
                    return 2;
                  }
                  memcpy(p->CodersData,___result__,_i_1);
                  sd2_local = (CSzData *)p;
                }
                if (__result___1._3_1_ != '\0') {
                  if (sd.Data != (Byte *)0x0) {
                    return 0x10;
                  }
                  _numFolders = sd2->Data;
                  sd.Data = (Byte *)sd2->Size;
                }
                __result___11 = WaitId((CSzData *)&numFolders,0xc);
                p_local._4_4_ = __result___11;
                if (__result___11 == 0) {
                  if (startBufPtr._4_4_ == 0) {
                    sd2_local[4].Data = (Byte *)0x0;
                  }
                  else {
                    pBVar5 = (Byte *)(**(code **)sd.Size)(sd.Size,(ulong)startBufPtr._4_4_ << 3);
                    sd2_local[4].Data = pBVar5;
                    if (pBVar5 == (Byte *)0x0) {
                      return 2;
                    }
                  }
                  for (local_168 = 0; local_168 < startBufPtr._4_4_; local_168 = local_168 + 1) {
                    SVar2 = ReadNumber((CSzData *)&numFolders,
                                       (UInt64 *)(sd2_local[4].Data + (ulong)local_168 * 8));
                    if (SVar2 != 0) {
                      return SVar2;
                    }
                    type._4_4_ = 0;
                  }
                  do {
                    while( true ) {
                      SVar2 = ReadNumber((CSzData *)&numFolders,(UInt64 *)&__result___13);
                      if (SVar2 != 0) {
                        return SVar2;
                      }
                      if (___result___13 == 0) {
                        sd2->Data = _numFolders;
                        sd2->Size = (size_t)sd.Data;
                        return 0;
                      }
                      if (___result___13 != 10) break;
                      SVar2 = ReadBitUi32s((CSzData *)&numFolders,packStreamIndex,
                                           (CSzBitUi32s *)(sd2_local + 1),(ISzAlloc *)sd.Size);
                      if (SVar2 != 0) {
                        return SVar2;
                      }
                    }
                    p_local._4_4_ = SkipData((CSzData *)&numFolders);
                  } while (p_local._4_4_ == 0);
                }
              }
            }
          }
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static SRes ReadUnpackInfo(CSzAr *p,
    CSzData *sd2,
    UInt32 numFoldersMax,
    const CBuf *tempBufs, UInt32 numTempBufs,
    ISzAlloc *alloc)
{
  CSzData sd;
  
  UInt32 fo, numFolders, numCodersOutStreams, packStreamIndex;
  const Byte *startBufPtr;
  Byte external;
  
  RINOK(WaitId(sd2, k7zIdFolder));
  
  RINOK(SzReadNumber32(sd2, &numFolders));
  if (numFolders > numFoldersMax)
    return SZ_ERROR_UNSUPPORTED;
  p->NumFolders = numFolders;

  SZ_READ_BYTE_SD(sd2, external);
  if (external == 0)
    sd = *sd2;
  else
  {
    UInt32 index;
    RINOK(SzReadNumber32(sd2, &index));
    if (index >= numTempBufs)
      return SZ_ERROR_ARCHIVE;
    sd.Data = tempBufs[index].data;
    sd.Size = tempBufs[index].size;
  }
  
  MY_ALLOC(size_t, p->FoCodersOffsets, (size_t)numFolders + 1, alloc);
  MY_ALLOC(UInt32, p->FoStartPackStreamIndex, (size_t)numFolders + 1, alloc);
  MY_ALLOC(UInt32, p->FoToCoderUnpackSizes, (size_t)numFolders + 1, alloc);
  MY_ALLOC(Byte, p->FoToMainUnpackSizeIndex, (size_t)numFolders, alloc);
  
  startBufPtr = sd.Data;
  
  packStreamIndex = 0;
  numCodersOutStreams = 0;

  for (fo = 0; fo < numFolders; fo++)
  {
    UInt32 numCoders, ci, numInStreams = 0;
    
    p->FoCodersOffsets[fo] = sd.Data - startBufPtr;
    
    RINOK(SzReadNumber32(&sd, &numCoders));
    if (numCoders == 0 || numCoders > k_Scan_NumCoders_MAX)
      return SZ_ERROR_UNSUPPORTED;
    
    for (ci = 0; ci < numCoders; ci++)
    {
      Byte mainByte;
      unsigned idSize;
      UInt32 coderInStreams;
      
      SZ_READ_BYTE_2(mainByte);
      if ((mainByte & 0xC0) != 0)
        return SZ_ERROR_UNSUPPORTED;
      idSize = (mainByte & 0xF);
      if (idSize > 8)
        return SZ_ERROR_UNSUPPORTED;
      if (idSize > sd.Size)
        return SZ_ERROR_ARCHIVE;
      SKIP_DATA2(sd, idSize);
      
      coderInStreams = 1;
      
      if ((mainByte & 0x10) != 0)
      {
        UInt32 coderOutStreams;
        RINOK(SzReadNumber32(&sd, &coderInStreams));
        RINOK(SzReadNumber32(&sd, &coderOutStreams));
        if (coderInStreams > k_Scan_NumCodersStreams_in_Folder_MAX || coderOutStreams != 1)
          return SZ_ERROR_UNSUPPORTED;
      }
      
      numInStreams += coderInStreams;

      if ((mainByte & 0x20) != 0)
      {
        UInt32 propsSize;
        RINOK(SzReadNumber32(&sd, &propsSize));
        if (propsSize > sd.Size)
          return SZ_ERROR_ARCHIVE;
        SKIP_DATA2(sd, propsSize);
      }
    }
    
    {
      UInt32 indexOfMainStream = 0;
      UInt32 numPackStreams = 1;
      
      if (numCoders != 1 || numInStreams != 1)
      {
        Byte streamUsed[k_Scan_NumCodersStreams_in_Folder_MAX];
        Byte coderUsed[k_Scan_NumCoders_MAX];
    
        UInt32 i;
        UInt32 numBonds = numCoders - 1;
        if (numInStreams < numBonds)
          return SZ_ERROR_ARCHIVE;
        
        if (numInStreams > k_Scan_NumCodersStreams_in_Folder_MAX)
          return SZ_ERROR_UNSUPPORTED;
        
        for (i = 0; i < numInStreams; i++)
          streamUsed[i] = False;
        for (i = 0; i < numCoders; i++)
          coderUsed[i] = False;
        
        for (i = 0; i < numBonds; i++)
        {
          UInt32 index;
          
          RINOK(SzReadNumber32(&sd, &index));
          if (index >= numInStreams || streamUsed[index])
            return SZ_ERROR_ARCHIVE;
          streamUsed[index] = True;
          
          RINOK(SzReadNumber32(&sd, &index));
          if (index >= numCoders || coderUsed[index])
            return SZ_ERROR_ARCHIVE;
          coderUsed[index] = True;
        }
        
        numPackStreams = numInStreams - numBonds;
        
        if (numPackStreams != 1)
          for (i = 0; i < numPackStreams; i++)
          {
            UInt32 index;
            RINOK(SzReadNumber32(&sd, &index));
            if (index >= numInStreams || streamUsed[index])
              return SZ_ERROR_ARCHIVE;
            streamUsed[index] = True;
          }
          
        for (i = 0; i < numCoders; i++)
          if (!coderUsed[i])
          {
            indexOfMainStream = i;
            break;
          }
 
        if (i == numCoders)
          return SZ_ERROR_ARCHIVE;
      }
      
      p->FoStartPackStreamIndex[fo] = packStreamIndex;
      p->FoToCoderUnpackSizes[fo] = numCodersOutStreams;
      p->FoToMainUnpackSizeIndex[fo] = (Byte)indexOfMainStream;
      numCodersOutStreams += numCoders;
      if (numCodersOutStreams < numCoders)
        return SZ_ERROR_UNSUPPORTED;
      if (numPackStreams > p->NumPackStreams - packStreamIndex)
        return SZ_ERROR_ARCHIVE;
      packStreamIndex += numPackStreams;
    }
  }

  p->FoToCoderUnpackSizes[fo] = numCodersOutStreams;
  
  {
    size_t dataSize = sd.Data - startBufPtr;
    p->FoStartPackStreamIndex[fo] = packStreamIndex;
    p->FoCodersOffsets[fo] = dataSize;
    MY_ALLOC_ZE_AND_CPY(p->CodersData, dataSize, startBufPtr, alloc);
  }
  
  if (external != 0)
  {
    if (sd.Size != 0)
      return SZ_ERROR_ARCHIVE;
    sd = *sd2;
  }
  
  RINOK(WaitId(&sd, k7zIdCodersUnpackSize));
  
  MY_ALLOC_ZE(UInt64, p->CoderUnpackSizes, (size_t)numCodersOutStreams, alloc);
  {
    UInt32 i;
    for (i = 0; i < numCodersOutStreams; i++)
    {
      RINOK(ReadNumber(&sd, p->CoderUnpackSizes + i));
    }
  }

  for (;;)
  {
    UInt64 type;
    RINOK(ReadID(&sd, &type));
    if (type == k7zIdEnd)
    {
      *sd2 = sd;
      return SZ_OK;
    }
    if (type == k7zIdCRC)
    {
      RINOK(ReadBitUi32s(&sd, numFolders, &p->FolderCRCs, alloc));
      continue;
    }
    RINOK(SkipData(&sd));
  }
}